

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool.c
# Opt level: O3

void remove_tool_from_list(tool_t *target)

{
  char *__s2;
  char *__s1;
  int iVar1;
  tool_t *ptVar2;
  tool_t *ptVar3;
  tool_t **pptVar4;
  
  ptVar3 = tools;
  if (tools != (tool_t *)0x0) {
    __s2 = target->tool_name;
    iVar1 = strcmp(tools->tool_name,__s2);
    if (iVar1 == 0) {
      pptVar4 = &tools;
    }
    else {
      do {
        ptVar2 = ptVar3;
        ptVar3 = ptVar2->next_tool;
        __s1 = ptVar3->tool_name;
        iVar1 = strcmp(__s1,__s2);
      } while (iVar1 != 0);
      iVar1 = strcmp(__s1,__s2);
      if (iVar1 != 0) {
        return;
      }
      pptVar4 = &ptVar2->next_tool;
      ptVar3 = target;
    }
    *pptVar4 = ptVar3->next_tool;
  }
  return;
}

Assistant:

void remove_tool_from_list(struct tool_t* target){
     if(!tools){
        return;
     }
     if(!tool_equal(tools,target)){
        tools = tools->next_tool;
        return;
     }
     struct tool_t *cur = tools;
     while( (cur!=NULL) && (cur->next_tool != NULL) && (tool_equal(cur->next_tool,target))){
        cur = cur->next_tool;
     }
     if(!tool_equal(cur->next_tool,target)){
        cur->next_tool = target->next_tool; 
     }
}